

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

QDateTime * __thiscall
QDateTimeEditPrivate::validateAndInterpret
          (QDateTimeEditPrivate *this,QString *input,int *position,State *state,bool fixup)

{
  longlong lVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  longlong *plVar5;
  qsizetype qVar6;
  qsizetype qVar7;
  ulong uVar8;
  int iVar9;
  int *in_RCX;
  QDateTime *in_RDX;
  long *in_RSI;
  QDateTime *in_RDI;
  int *in_R8;
  byte in_R9B;
  long in_FS_OFFSET;
  int i;
  int max;
  bool changeCase;
  QChar sc;
  QChar ic;
  StateNode tmp;
  QDateTime *in_stack_fffffffffffffe18;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  QVariant *in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  byte bVar10;
  byte bVar11;
  QString *in_stack_fffffffffffffe38;
  int local_18c;
  undefined1 local_158 [24];
  QDateTime local_140 [8];
  QDateTime local_138 [32];
  char16_t local_118;
  char16_t local_116;
  char16_t local_114;
  char16_t local_112;
  qsizetype local_110;
  qsizetype local_108;
  undefined1 *local_100;
  undefined8 local_f8;
  undefined1 *local_f0;
  QVariant local_e8;
  QVariant local_c8;
  QVariant local_a8;
  QVariant local_88;
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QString::isEmpty((QString *)0x55eb48);
  if (bVar2) {
    qVar6 = QList<QDateTimeParser::SectionNode>::size
                      ((QList<QDateTimeParser::SectionNode> *)(in_RSI + 0x81));
    if ((qVar6 == 1) || (bVar2 = QString::isEmpty((QString *)0x55eb7d), !bVar2)) {
      *in_R8 = 1;
    }
    else {
      *in_R8 = 0;
    }
    (**(code **)(*in_RSI + 0xa8))(&local_28);
    ::QVariant::toDateTime();
    ::QVariant::~QVariant(&local_28);
  }
  else {
    bVar2 = ::operator==((QString *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                         (QString *)in_stack_fffffffffffffe18);
    if ((bVar2) && ((in_R9B & 1) == 0)) {
      *in_R8 = (int)in_RSI[0x79];
      ::QVariant::toDateTime();
    }
    else {
      bVar2 = QString::isEmpty((QString *)0x55ec2f);
      if (!bVar2) {
        bVar2 = false;
        local_108 = QString::size((QString *)(in_RSI + 0x51));
        local_110 = QString::size((QString *)in_RDX);
        plVar5 = qMin<long_long>(&local_108,&local_110);
        lVar1 = *plVar5;
        for (local_18c = 0; local_18c < (int)lVar1; local_18c = local_18c + 1) {
          local_112 = 0xaaaa;
          local_112 = (char16_t)
                      QString::at((QString *)in_stack_fffffffffffffe28,
                                  CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
          local_114 = 0xaaaa;
          local_114 = (char16_t)
                      QString::at((QString *)in_stack_fffffffffffffe28,
                                  CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
          bVar3 = ::operator!=((QChar *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20
                                                ),(QChar *)in_stack_fffffffffffffe18);
          if (bVar3) {
            local_116 = (char16_t)
                        QChar::toLower((QChar *)CONCAT17(in_stack_fffffffffffffe27,
                                                         in_stack_fffffffffffffe20));
            local_118 = (char16_t)
                        QChar::toLower((QChar *)CONCAT17(in_stack_fffffffffffffe27,
                                                         in_stack_fffffffffffffe20));
            bVar3 = ::operator==((QChar *)CONCAT17(in_stack_fffffffffffffe27,
                                                   in_stack_fffffffffffffe20),
                                 (QChar *)in_stack_fffffffffffffe18);
            if (!bVar3) break;
            bVar2 = true;
          }
        }
        if (local_18c == (int)lVar1) {
          qVar6 = QString::size((QString *)(in_RSI + 0x51));
          qVar7 = QString::size((QString *)in_RDX);
          iVar9 = 1;
          if (qVar6 == qVar7) {
            iVar9 = 2;
          }
          *in_R8 = iVar9;
          if (bVar2) {
            QString::left(in_stack_fffffffffffffe38,
                          CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
            QString::operator=((QString *)
                               CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                               (QString *)in_stack_fffffffffffffe18);
            QString::~QString((QString *)0x55ee02);
          }
          ::QVariant::toDateTime();
          goto LAB_0055f1da;
        }
      }
      local_100 = &DAT_aaaaaaaaaaaaaaaa;
      local_f8 = &DAT_aaaaaaaaaaaaaaaa;
      local_f0 = &DAT_aaaaaaaaaaaaaaaa;
      iVar4 = (int)in_RSI + 0x3d8;
      iVar9 = *in_RCX;
      ::QVariant::toDateTime();
      QDateTimeParser::parse((QString *)&local_100,iVar4,in_RDX,SUB41(iVar9,0));
      QDateTime::~QDateTime(local_138);
      QString::operator=((QString *)in_RDX,(QString *)(in_RSI + 0x7e));
      QDateTime::toTimeZone((QTimeZone *)local_140);
      QDateTime::operator=
                ((QDateTime *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                 in_stack_fffffffffffffe18);
      QDateTime::~QDateTime(local_140);
      uVar8 = QDateTime::isValid();
      if (((uVar8 & 1) == 0) && ((int)local_f8 == 2)) {
        local_f8 = (undefined1 *)CONCAT44(local_f8._4_4_,1);
      }
      *in_RCX = local_f8._4_4_ + *in_RCX;
      *in_R8 = (int)local_f8;
      if (*in_R8 == 2) {
        bVar10 = 0;
        bVar11 = bVar10;
        if (((ulong)local_f0 & 1) != 0) {
          in_stack_fffffffffffffe28 = (QVariant *)(in_RSI + 0x9b);
          ::QVariant::QVariant(&local_48,(QDateTime *)&local_100);
          bVar10 = ::operator!=((QVariant *)
                                CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                                (QVariant *)in_stack_fffffffffffffe18);
          bVar11 = bVar10;
          ::QVariant::~QVariant(&local_48);
        }
        if ((bVar10 & 1) == 0) {
          QString::operator=((QString *)(in_RSI + 0x66),(QString *)in_RDX);
          *(int *)(in_RSI + 0x79) = *in_R8;
          ::QVariant::QVariant(&local_c8,(QDateTime *)&local_100);
          ::QVariant::operator=
                    (in_stack_fffffffffffffe28,
                     (QVariant *)CONCAT17(bVar10,in_stack_fffffffffffffe20));
          ::QVariant::~QVariant(&local_c8);
        }
        else {
          ::QVariant::QVariant(&local_68,(QDateTime *)&local_100);
          ::QVariant::operator=
                    (in_stack_fffffffffffffe28,
                     (QVariant *)CONCAT17(bVar10,in_stack_fffffffffffffe20));
          ::QVariant::~QVariant(&local_68);
          (**(code **)(*in_RSI + 0xf8))();
          ::QVariant::QVariant(&local_88,(QDateTime *)&local_100);
          (**(code **)(*in_RSI + 0xd8))(local_158,in_RSI,&local_88);
          QString::operator=((QString *)CONCAT17(bVar10,in_stack_fffffffffffffe20),
                             (QString *)in_stack_fffffffffffffe18);
          QString::~QString((QString *)0x55f092);
          ::QVariant::~QVariant(&local_88);
          ::QVariant::QVariant(&local_a8,(QDateTime *)&local_100);
          updateCache((QDateTimeEditPrivate *)CONCAT17(bVar11,in_stack_fffffffffffffe30),
                      in_stack_fffffffffffffe28,
                      (QString *)CONCAT17(bVar10,in_stack_fffffffffffffe20));
          ::QVariant::~QVariant(&local_a8);
          ::QVariant::clear();
        }
      }
      else {
        (**(code **)(*in_RSI + 0xf8))();
      }
      uVar8 = QDateTime::isNull();
      if ((uVar8 & 1) == 0) {
        QDateTime::QDateTime(in_RDI,(QDateTime *)&local_100);
      }
      else {
        (**(code **)(*in_RSI + 0xa8))(&local_e8);
        ::QVariant::toDateTime();
        ::QVariant::~QVariant(&local_e8);
      }
      QDateTimeParser::StateNode::~StateNode((StateNode *)0x55f1da);
    }
  }
LAB_0055f1da:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDateTime QDateTimeEditPrivate::validateAndInterpret(QString &input, int &position,
                                                     QValidator::State &state, bool fixup) const
{
    if (input.isEmpty()) {
        if (sectionNodes.size() == 1 || !specialValueText.isEmpty()) {
            state = QValidator::Intermediate;
        } else {
            state = QValidator::Invalid;
        }
        return getZeroVariant().toDateTime();
    } else if (cachedText == input && !fixup) {
        state = cachedState;
        return cachedValue.toDateTime();
    } else if (!specialValueText.isEmpty()) {
        bool changeCase = false;
        const int max = qMin(specialValueText.size(), input.size());
        int i;
        for (i=0; i<max; ++i) {
            const QChar ic = input.at(i);
            const QChar sc = specialValueText.at(i);
            if (ic != sc) {
                if (sc.toLower() == ic.toLower()) {
                    changeCase = true;
                } else {
                    break;
                }
            }
        }
        if (i == max) {
            state = specialValueText.size() == input.size() ? QValidator::Acceptable : QValidator::Intermediate;
            if (changeCase) {
                input = specialValueText.left(max);
            }
            return minimum.toDateTime();
        }
    }

    StateNode tmp = parse(input, position, value.toDateTime(), fixup);
    // Take note of any corrections imposed during parsing:
    input = m_text;
    // TODO: if the format specifies time-zone, update timeZone to match the
    // parsed text; but we're in const context, so can't - QTBUG-118393.
    // Impose this widget's time system:
    tmp.value = tmp.value.toTimeZone(timeZone);
    // ... but that might turn a valid datetime into an invalid one:
    if (!tmp.value.isValid() && tmp.state == Acceptable)
        tmp.state = Intermediate;

    position += tmp.padded;
    state = QValidator::State(int(tmp.state));
    if (state == QValidator::Acceptable) {
        if (tmp.conflicts && conflictGuard != tmp.value) {
            conflictGuard = tmp.value;
            clearCache();
            input = textFromValue(tmp.value);
            updateCache(tmp.value, input);
            conflictGuard.clear();
        } else {
            cachedText = input;
            cachedState = state;
            cachedValue = tmp.value;
        }
    } else {
        clearCache();
    }
    return (tmp.value.isNull() ? getZeroVariant().toDateTime() : tmp.value);
}